

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

DisasJumpType op_unpku(DisasContext_conflict13 *s,DisasOps *o)

{
  TCGContext_conflict12 *tcg_ctx;
  int iVar1;
  DisasJumpType DVar2;
  uintptr_t o_1;
  TCGv_i32 pTVar3;
  TCGTemp *local_38;
  TCGv_i64 local_30;
  TCGTemp *local_28;
  TCGv_i64 local_20;
  
  tcg_ctx = s->uc->tcg_ctx;
  iVar1 = get_field1(s,FLD_O_l1,FLD_C_b4);
  if ((iVar1 < 0x40 & (byte)iVar1) == 0) {
    gen_program_exception(s,6);
    DVar2 = DISAS_NORETURN;
  }
  else {
    pTVar3 = tcg_const_i32_s390x(tcg_ctx,iVar1 + 1);
    local_38 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
    local_30 = o->addr1 + (long)tcg_ctx;
    local_20 = o->in2 + (long)tcg_ctx;
    local_28 = (TCGTemp *)(pTVar3 + (long)tcg_ctx);
    tcg_gen_callN_s390x(tcg_ctx,helper_unpku,(TCGTemp *)(tcg_ctx->cc_op + (long)tcg_ctx),4,&local_38
                       );
    tcg_temp_free_internal_s390x(tcg_ctx,(TCGTemp *)(pTVar3 + (long)tcg_ctx));
    set_cc_static(s);
    DVar2 = DISAS_NEXT;
  }
  return DVar2;
}

Assistant:

static DisasJumpType op_unpku(DisasContext *s, DisasOps *o)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int l1 = get_field(s, l1) + 1;
    TCGv_i32 l;

    /* The length must be even and should not exceed 64 bytes.  */
    if ((l1 & 1) || (l1 > 64)) {
        gen_program_exception(s, PGM_SPECIFICATION);
        return DISAS_NORETURN;
    }
    l = tcg_const_i32(tcg_ctx, l1);
    gen_helper_unpku(tcg_ctx, tcg_ctx->cc_op, tcg_ctx->cpu_env, o->addr1, l, o->in2);
    tcg_temp_free_i32(tcg_ctx, l);
    set_cc_static(s);
    return DISAS_NEXT;
}